

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes
          (ConversionStream *this)

{
  anon_class_8_1_8991fb9c local_28;
  _List_node_base *local_20;
  iterator local_18;
  iterator ScopeStartToken;
  ConversionStream *this_local;
  
  ScopeStartToken._M_node = (_List_node_base *)this;
  local_18 = std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::begin(&this->m_Tokens);
  local_20 = (_List_node_base *)
             std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::end(&this->m_Tokens);
  local_28.this = this;
  ProcessScope<Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes()::__0>
            (this,&local_18,(iterator)local_20,OpenBrace,ClosingBrace,&local_28);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes()
{
    auto ScopeStartToken = m_Tokens.begin();
    ProcessScope(
        ScopeStartToken, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& Token, int ScopeDepth) //
        {
            // Search global scope only
            if (ScopeDepth != 0 || Token->Type != TokenType::OpenSquareBracket)
            {
                ++Token;
                return;
            }

            // [numthreads(16, 16, 1)]
            // ^
            auto OpenStaple = Token;
            ++Token;
            if (Token == m_Tokens.end())
                return;
            // [numthreads(16, 16, 1)]
            //  ^
            if (m_Converter.m_SpecialShaderAttributes.find(Token->Literal.c_str()) != m_Converter.m_SpecialShaderAttributes.end())
            {
                while (Token != m_Tokens.end() && Token->Type != TokenType::ClosingSquareBracket)
                    ++Token;
                // [numthreads(16, 16, 1)]
                //                       ^
                if (Token == m_Tokens.end())
                    return;
                ++Token;
                // [numthreads(16, 16, 1)]
                // void CS(uint3 ThreadId  : SV_DispatchThreadID)
                // ^
                if (Token != m_Tokens.end())
                    Token->Delimiter = OpenStaple->Delimiter + Token->Delimiter;
                m_Tokens.erase(OpenStaple, Token);
            }
            else
                ++Token;
        } //
    );
}